

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::CopyingInputStreamAdaptor
          (CopyingInputStreamAdaptor *this,CopyingInputStream *copying_stream,int block_size)

{
  int local_44;
  int block_size_local;
  CopyingInputStream *copying_stream_local;
  CopyingInputStreamAdaptor *this_local;
  
  ZeroCopyInputStream::ZeroCopyInputStream(&this->super_ZeroCopyInputStream);
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__CopyingInputStreamAdaptor_0033e5d8;
  this->copying_stream_ = copying_stream;
  this->owns_copying_stream_ = false;
  this->failed_ = false;
  this->position_ = 0;
  internal::scoped_array<unsigned_char>::scoped_array(&this->buffer_,(uchar *)0x0);
  local_44 = block_size;
  if (block_size < 1) {
    local_44 = 0x2000;
  }
  this->buffer_size_ = local_44;
  this->buffer_used_ = 0;
  this->backup_bytes_ = 0;
  return;
}

Assistant:

CopyingInputStreamAdaptor::CopyingInputStreamAdaptor(
    CopyingInputStream* copying_stream, int block_size)
  : copying_stream_(copying_stream),
    owns_copying_stream_(false),
    failed_(false),
    position_(0),
    buffer_size_(block_size > 0 ? block_size : kDefaultBlockSize),
    buffer_used_(0),
    backup_bytes_(0) {
}